

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

bool __thiscall
Clasp::ShortImplicationsGraph::propagateBin
          (ShortImplicationsGraph *this,Assignment *out,Literal p,uint32 level)

{
  pointer pIVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  Antecedent local_38;
  
  uVar7 = (ulong)(p.rep_ >> 1);
  pIVar1 = (this->graph_).ebo_.buf;
  lVar2 = (long)pIVar1[uVar7].super_ImpListBase.super_type.
                super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                buf_;
  uVar6 = (ulong)pIVar1[uVar7].super_ImpListBase.super_type.
                 super_left_right_rep<Clasp::Literal,_std::pair<Clasp::Literal,_Clasp::Literal>_>.
                 left_;
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    if (uVar6 == uVar5) break;
    local_38.data_ = uVar7 << 0x21 | 2;
    bVar4 = Assignment::assign(out,(Literal)*(uint32 *)(lVar2 + uVar5),level,&local_38);
    uVar3 = uVar5 + 4;
  } while (bVar4);
  return uVar6 == uVar5;
}

Assistant:

bool ShortImplicationsGraph::propagateBin(Assignment& out, Literal p, uint32 level) const {
	const ImplicationList& x = graph_[p.id()];
	Antecedent ante(p);
	for (ImplicationList::const_left_iterator it = x.left_begin(), end = x.left_end(); it != end; ++it) {
		if (!out.assign(*it, level, p)) { return false; }
	}
	return true;
}